

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::matchNext
          (GenMatcher *this,uint specVar,TermList nodeTerm,bool separate)

{
  bool bVar1;
  uint *puVar2;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,separate) != 0) {
    puVar2 = (this->_boundVars)._cursor;
    if (puVar2 == (this->_boundVars)._end) {
      Lib::Stack<unsigned_int>::expand(&this->_boundVars);
      puVar2 = (this->_boundVars)._cursor;
    }
    *puVar2 = 0xffffffff;
    (this->_boundVars)._cursor = puVar2 + 1;
  }
  bVar1 = matchNextAux(this,(TermList)(this->_specVars)._array[specVar]._content,nodeTerm,separate);
  return bVar1;
}

Assistant:

bool SubstitutionTree<LeafData_>::GenMatcher::matchNext(unsigned specVar, TermList nodeTerm, bool separate)
{
  if(separate) {
    _boundVars.push(BACKTRACK_SEPARATOR);
  }

  TermList queryTerm=(_specVars)[specVar];

  return matchNextAux(queryTerm, nodeTerm, separate);
}